

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btSoftRigidDynamicsWorld::internalSingleStepSimulation
          (btSoftRigidDynamicsWorld *this,btScalar timeStep)

{
  btSoftBodySolver *pbVar1;
  int iVar2;
  btSoftBodyArray *pbVar3;
  btSoftRigidDynamicsWorld *in_RDI;
  undefined4 in_XMM0_Da;
  btScalar in_stack_0000000c;
  btDiscreteDynamicsWorld *in_stack_00000010;
  btSoftBody *psb;
  int i;
  btSoftBody *in_stack_00000068;
  btSoftBody *in_stack_00000070;
  undefined8 in_stack_ffffffffffffffe8;
  btScalar timeStep_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  int n;
  
  timeStep_00 = (btScalar)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  pbVar1 = in_RDI->m_softBodySolver;
  pbVar3 = getSoftBodyArray(in_RDI);
  (*pbVar1->_vptr_btSoftBodySolver[4])(pbVar1,pbVar3,0);
  (*in_RDI->m_softBodySolver->_vptr_btSoftBodySolver[3])();
  btDiscreteDynamicsWorld::internalSingleStepSimulation(in_stack_00000010,in_stack_0000000c);
  solveSoftBodiesConstraints
            ((btSoftRigidDynamicsWorld *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),timeStep_00)
  ;
  iVar4 = 0;
  while (n = iVar4, iVar2 = btAlignedObjectArray<btSoftBody_*>::size(&in_RDI->m_softBodies),
        iVar4 < iVar2) {
    btAlignedObjectArray<btSoftBody_*>::operator[](&in_RDI->m_softBodies,n);
    btSoftBody::defaultCollisionHandler(in_stack_00000070,in_stack_00000068);
    iVar4 = n + 1;
  }
  (*in_RDI->m_softBodySolver->_vptr_btSoftBodySolver[8])();
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::internalSingleStepSimulation( btScalar timeStep )
{

	// Let the solver grab the soft bodies and if necessary optimize for it
	m_softBodySolver->optimize( getSoftBodyArray() );

	if( !m_softBodySolver->checkInitialized() )
	{
		btAssert( "Solver initialization failed\n" );
	}

	btDiscreteDynamicsWorld::internalSingleStepSimulation( timeStep );

	///solve soft bodies constraints
	solveSoftBodiesConstraints( timeStep );

	//self collisions
	for ( int i=0;i<m_softBodies.size();i++)
	{
		btSoftBody*	psb=(btSoftBody*)m_softBodies[i];
		psb->defaultCollisionHandler(psb);
	}

	///update soft bodies
	m_softBodySolver->updateSoftBodies( );
	
	// End solver-wise simulation step
	// ///////////////////////////////

}